

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AssertBase *stmt)

{
  undefined1 *puVar1;
  uint64_t uVar2;
  int iVar3;
  ostream *poVar4;
  string_view sVar5;
  undefined1 local_58 [8];
  shared_ptr<kratos::AssertPropertyStmt> st;
  
  iVar3 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[0xd])(stmt);
  if (iVar3 == 0) {
    puVar1 = &(this->stream_).super_stringstream.field_0x10;
    sVar5 = indent(this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,sVar5._M_str,sVar5._M_len);
    poVar4 = std::operator<<(poVar4,"assert (");
    Stream::var_str_abi_cxx11_
              ((string *)local_58,&this->stream_,(Var *)stmt[1].super_Stmt.super_IRNode._vptr_IRNode
              );
    poVar4 = std::operator<<(poVar4,(string *)local_58);
    std::operator<<(poVar4,")");
    std::__cxx11::string::~string((string *)local_58);
    if (stmt[1].super_Stmt.super_IRNode.fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      poVar4 = std::operator<<((ostream *)puVar1,";");
      puVar1 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar1 = *(long *)puVar1 + 1;
      std::operator<<(poVar4,'\n');
    }
    else {
      std::operator<<((ostream *)puVar1," else ");
      uVar2 = this->indent_;
      this->indent_ = 0;
      (**this->_vptr_SystemVerilogCodeGen)
                (this,stmt[1].super_Stmt.super_IRNode.fn_name_ln.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
      this->indent_ = uVar2;
    }
  }
  else {
    Stmt::as<kratos::AssertPropertyStmt>((Stmt *)local_58);
    stmt_code(this,(AssertPropertyStmt *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&st);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AssertBase* stmt) {
    if (stmt->assert_type() == AssertType::AssertValue) {
        auto* st = reinterpret_cast<AssertValueStmt*>(stmt);
        stream_ << indent() << "assert (" << stream_.var_str(st->value()) << ")";
        if (st->else_()) {
            stream_ << " else ";
            // turn off the indent
            auto temp = indent_;
            indent_ = 0;
            dispatch_node(st->else_().get());
            indent_ = temp;
            // dispatch code will close the ;
        } else {
            stream_ << ";" << stream_.endl();
        }
    } else {
        auto st = stmt->as<AssertPropertyStmt>();
        stmt_code(st.get());
    }
}